

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page-queue.c
# Opt level: O1

void mi_page_queue_push(mi_heap_t *heap,mi_page_queue_t *queue,mi_page_t *page)

{
  mi_page_s *pmVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  mi_page_t *pmVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  mi_page_queue_t *pmVar10;
  mi_page_s **ppmVar11;
  ulong uVar12;
  ulong uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  
  (page->flags).full_aligned = (page->flags).full_aligned & 0xfe | queue->block_size == 0x10010;
  pmVar1 = queue->first;
  page->next = pmVar1;
  page->prev = (mi_page_s *)0x0;
  ppmVar11 = &pmVar1->prev;
  if (pmVar1 == (mi_page_s *)0x0) {
    ppmVar11 = &queue->last;
  }
  *ppmVar11 = page;
  queue->first = page;
  auVar4 = _DAT_004bee60;
  auVar3 = _DAT_004bc820;
  uVar12 = queue->block_size;
  if (uVar12 < 0x401) {
    pmVar5 = &_mi_page_empty;
    if (page != (mi_page_t *)0x0) {
      pmVar5 = page;
    }
    if (*(mi_page_t **)((long)heap->pages_free_direct + (uVar12 + 7 & 0xfffffffffffffff8)) != pmVar5
       ) {
      uVar7 = uVar12 + 7 >> 3;
      if (uVar12 < 9) {
        uVar12 = 0;
      }
      else {
        if (uVar12 < 0x41) {
          uVar12 = (ulong)((int)uVar7 + 1U & 0x1e);
        }
        else {
          uVar12 = uVar7 - 1;
          uVar9 = 0x3f;
          if (uVar12 != 0) {
            for (; uVar12 >> uVar9 == 0; uVar9 = uVar9 - 1) {
            }
          }
          uVar12 = ((ulong)((uint)(uVar12 >> (0x3dU - (char)(uVar9 ^ 0x3f) & 0x3f)) & 3) +
                    ((uVar9 ^ 0x3f) & 0xffffffff) * 4 ^ 0xfc) - 3;
        }
        pmVar10 = queue + -1;
        do {
          uVar9 = pmVar10->block_size + 7;
          uVar13 = uVar9 >> 3;
          if (uVar9 < 0x48) {
            uVar6 = (ulong)((int)uVar13 + 1U & 0x1e);
            if (uVar9 < 0x10) {
              uVar6 = 1;
            }
          }
          else if (uVar9 < 0x10008) {
            uVar9 = uVar13 - 1;
            uVar6 = 0x3f;
            if (uVar9 != 0) {
              for (; uVar9 >> uVar6 == 0; uVar6 = uVar6 - 1) {
              }
            }
            uVar6 = ((ulong)((uint)(uVar9 >> (0x3dU - (char)(uVar6 ^ 0x3f) & 0x3f)) & 3) +
                     ((uVar6 ^ 0x3f) & 0xffffffff) * 4 ^ 0xfc) - 3;
          }
          else {
            uVar6 = 0x49;
          }
        } while ((uVar12 == uVar6) && (bVar2 = heap->pages < pmVar10, pmVar10 = pmVar10 + -1, bVar2)
                );
        uVar12 = uVar13 + 1;
        if (uVar7 <= uVar13) {
          uVar12 = uVar7;
        }
      }
      if (uVar12 <= uVar7) {
        lVar8 = uVar7 - uVar12;
        auVar14._8_4_ = (int)lVar8;
        auVar14._0_8_ = lVar8;
        auVar14._12_4_ = (int)((ulong)lVar8 >> 0x20);
        uVar7 = 0;
        auVar14 = auVar14 ^ _DAT_004bc820;
        do {
          auVar15._8_4_ = (int)uVar7;
          auVar15._0_8_ = uVar7;
          auVar15._12_4_ = (int)(uVar7 >> 0x20);
          auVar15 = (auVar15 | auVar4) ^ auVar3;
          if ((bool)(~(auVar15._4_4_ == auVar14._4_4_ && auVar14._0_4_ < auVar15._0_4_ ||
                      auVar14._4_4_ < auVar15._4_4_) & 1)) {
            heap->pages_free_direct[uVar12 + uVar7] = pmVar5;
          }
          if ((auVar15._12_4_ != auVar14._12_4_ || auVar15._8_4_ <= auVar14._8_4_) &&
              auVar15._12_4_ <= auVar14._12_4_) {
            heap->pages_free_direct[uVar12 + uVar7 + 1] = pmVar5;
          }
          uVar7 = uVar7 + 2;
        } while ((lVar8 + 2U & 0xfffffffffffffffe) != uVar7);
      }
    }
  }
  heap->page_count = heap->page_count + 1;
  return;
}

Assistant:

static void mi_page_queue_push(mi_heap_t* heap, mi_page_queue_t* queue, mi_page_t* page) {
  mi_assert_internal(mi_page_heap(page) == heap);
  mi_assert_internal(!mi_page_queue_contains(queue, page));
  #if MI_HUGE_PAGE_ABANDON
  mi_assert_internal(_mi_page_segment(page)->kind != MI_SEGMENT_HUGE);
  #endif
  mi_assert_internal(mi_page_block_size(page) == queue->block_size ||
                      (mi_page_is_large_or_huge(page) && mi_page_queue_is_huge(queue)) ||
                        (mi_page_is_in_full(page) && mi_page_queue_is_full(queue)));

  mi_page_set_in_full(page, mi_page_queue_is_full(queue));
  // mi_atomic_store_ptr_release(mi_atomic_cast(void*, &page->heap), heap);
  page->next = queue->first;
  page->prev = NULL;
  if (queue->first != NULL) {
    mi_assert_internal(queue->first->prev == NULL);
    queue->first->prev = page;
    queue->first = page;
  }
  else {
    queue->first = queue->last = page;
  }

  // update direct
  mi_heap_queue_first_update(heap, queue);
  heap->page_count++;
}